

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_url_encode(char *src,char *dst,size_t dst_len)

{
  ushort **ppuVar1;
  void *pvVar2;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  int local_38;
  byte *pbVar6;
  
  pbVar4 = (byte *)(dst + (dst_len - 1));
  bVar3 = *src;
  pbVar5 = (byte *)dst;
  if (pbVar4 <= dst || bVar3 == 0) {
LAB_0010fb68:
    *pbVar5 = 0;
    local_38 = (int)dst;
    return -(uint)(*src != 0) | (int)pbVar5 - local_38;
  }
  ppuVar1 = __ctype_b_loc();
  do {
    if ((((*ppuVar1)[bVar3] & 8) == 0) &&
       (pvVar2 = memchr("._-$,;~()",(int)(char)bVar3,10), pvVar2 == (void *)0x0)) {
      pbVar6 = pbVar5 + 2;
      if (pbVar4 <= pbVar6) goto LAB_0010fb68;
      *pbVar5 = 0x25;
      pbVar5[1] = "0123456789abcdef"[(byte)*src >> 4];
      pbVar5[2] = "0123456789abcdef"[(byte)*src & 0xf];
    }
    else {
      *pbVar5 = bVar3;
      pbVar6 = pbVar5;
    }
    pbVar5 = pbVar6 + 1;
    bVar3 = ((byte *)src)[1];
    src = (char *)((byte *)src + 1);
    if ((bVar3 == 0) || (pbVar4 <= pbVar5)) goto LAB_0010fb68;
  } while( true );
}

Assistant:

CIVETWEB_API int
mg_url_encode(const char *src, char *dst, size_t dst_len)
{
	static const char *dont_escape = "._-$,;~()";
	static const char *hex = "0123456789abcdef";
	char *pos = dst;
	const char *end = dst + dst_len - 1;

	for (; ((*src != '\0') && (pos < end)); src++, pos++) {
		if (isalnum((unsigned char)*src)
		    || (strchr(dont_escape, *src) != NULL)) {
			*pos = *src;
		} else if (pos + 2 < end) {
			pos[0] = '%';
			pos[1] = hex[(unsigned char)*src >> 4];
			pos[2] = hex[(unsigned char)*src & 0xf];
			pos += 2;
		} else {
			break;
		}
	}

	*pos = '\0';
	return (*src == '\0') ? (int)(pos - dst) : -1;
}